

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImDrawCmd>::push_back(ImVector<ImDrawCmd> *this,ImDrawCmd *v)

{
  ImDrawCmd *pIVar1;
  ImTextureID pvVar2;
  undefined8 uVar3;
  ImDrawCallback p_Var4;
  ImDrawCmd *pIVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  int new_capacity;
  
  iVar12 = this->Size;
  if (iVar12 == this->Capacity) {
    if (iVar12 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar12 / 2 + iVar12;
    }
    new_capacity = iVar12 + 1;
    if (iVar12 + 1 < iVar11) {
      new_capacity = iVar11;
    }
    reserve(this,new_capacity);
    iVar12 = this->Size;
  }
  pIVar1 = this->Data;
  pIVar1[iVar12].UserCallbackData = v->UserCallbackData;
  fVar7 = (v->ClipRect).x;
  fVar8 = (v->ClipRect).y;
  fVar9 = (v->ClipRect).z;
  fVar10 = (v->ClipRect).w;
  pvVar2 = v->TextureId;
  uVar3 = *(undefined8 *)&v->VtxOffset;
  uVar6 = *(undefined4 *)&v->field_0x24;
  p_Var4 = v->UserCallback;
  pIVar5 = pIVar1 + iVar12;
  pIVar5->ElemCount = v->ElemCount;
  *(undefined4 *)&pIVar5->field_0x24 = uVar6;
  *(ImDrawCallback *)(&pIVar5->ElemCount + 2) = p_Var4;
  pIVar1[iVar12].TextureId = pvVar2;
  (&pIVar1[iVar12].TextureId)[1] = (ImTextureID)uVar3;
  pIVar1 = pIVar1 + iVar12;
  (pIVar1->ClipRect).x = fVar7;
  (pIVar1->ClipRect).y = fVar8;
  (pIVar1->ClipRect).z = fVar9;
  (pIVar1->ClipRect).w = fVar10;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }